

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_> * __thiscall
libtorrent::torrent_handle::get_download_queue
          (vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
           *__return_storage_ptr__,torrent_handle *this)

{
  torrent_handle *this_local;
  vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_> *queue;
  
  ::std::vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>::
  vector(__return_storage_ptr__);
  sync_call<void(libtorrent::aux::torrent::*)(std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*)const,std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*>
            (this,0x68ec10,
             (vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
              **)0x0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<partial_piece_info> torrent_handle::get_download_queue() const
	{
		std::vector<partial_piece_info> queue;
		sync_call(&aux::torrent::get_download_queue, &queue);
		return queue;
	}